

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O3

Vector3D * __thiscall
CMU462::Vertex::neighborhoodCentroid(Vector3D *__return_storage_ptr__,Vertex *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  Vector3D *c;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  p_Var1 = (this->_halfedge)._M_node;
  dVar5 = 0.0;
  dVar6 = 0.0;
  dVar4 = 0.0;
  dVar7 = 0.0;
  p_Var3 = p_Var1;
  do {
    p_Var2 = p_Var3[2]._M_next[2]._M_prev;
    dVar4 = dVar4 + (double)p_Var2[2]._M_prev;
    dVar5 = dVar5 + (double)p_Var2[1]._M_prev;
    dVar6 = dVar6 + (double)p_Var2[2]._M_next;
    dVar7 = dVar7 + 1.0;
    p_Var3 = p_Var3[1]._M_prev[2]._M_next;
  } while (p_Var3 != p_Var1);
  dVar7 = 1.0 / dVar7;
  __return_storage_ptr__->x = dVar7 * dVar5;
  __return_storage_ptr__->y = dVar7 * dVar6;
  __return_storage_ptr__->z = dVar7 * dVar4;
  return __return_storage_ptr__;
}

Assistant:

Vector3D Vertex::neighborhoodCentroid() const
  {
    Vector3D c( 0., 0., 0. ); // centroid
    double d = 0.; // degree (i.e., number of neighbors)

    // Iterate over neighbors.
    HalfedgeCIter h = halfedge();
    do {
      // Add the contribution of the neighbor,
      // and increment the number of neighbors.
      c += h->next()->vertex()->position;
      d += 1.;

      h = h->twin()->next();
    } while( h != halfedge() );

    c /= d; // compute the average

    return c;
  }